

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

strbuf * des_decrypt_xdmauth_wrapper(ptrlen key,ptrlen data)

{
  strbuf *psVar1;
  char *p;
  
  if (key.len == 7) {
    if (((undefined1  [16])data & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      psVar1 = strbuf_dup(data);
      des_decrypt_xdmauth(key.ptr,psVar1->u,(int)psVar1->len);
      return psVar1;
    }
    p = "des_decrypt_xdmauth: data must be a multiple of 8 bytes";
  }
  else {
    p = "des_decrypt_xdmauth: key must be 7 bytes long";
  }
  fatal_error(p);
}

Assistant:

strbuf *des_decrypt_xdmauth_wrapper(ptrlen key, ptrlen data)
{
    if (key.len != 7)
        fatal_error("des_decrypt_xdmauth: key must be 7 bytes long");
    if (data.len % 8 != 0)
        fatal_error("des_decrypt_xdmauth: data must be a multiple of 8 bytes");
    strbuf *sb = strbuf_dup(data);
    des_decrypt_xdmauth(key.ptr, sb->u, sb->len);
    return sb;
}